

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::DirectStateAccess::Textures::CreationTest::iterate(CreationTest *this)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  ContextType ctxType;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  ContextInfo *this_00;
  TestContext *pTVar7;
  TestLog *pTVar8;
  MessageBuilder *pMVar9;
  Enum<int,_2UL> EVar10;
  uint local_3d8;
  uint local_3d4;
  GLuint j_1;
  GLuint i_2;
  Enum<int,_2UL> local_3c0;
  MessageBuilder local_3b0;
  uint local_230;
  uint local_22c;
  GLuint i_1;
  GLuint j;
  uint local_a8;
  GLuint i;
  undefined8 uStack_98;
  GLuint textures_dsa [11] [2];
  int local_38 [2];
  GLuint textures_legacy [2];
  bool is_error;
  bool is_ok;
  bool is_arb_direct_state_access;
  bool is_at_least_gl_45;
  Functions *gl;
  CreationTest *this_local;
  long lVar6;
  
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar5->_vptr_RenderContext[2])();
  textures_legacy[1] = (GLuint)glu::ApiType::core(4,5);
  bVar1 = glu::contextSupports(ctxType,(ApiType)textures_legacy[1]);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  textures_legacy[0]._3_1_ =
       glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_direct_state_access");
  if ((bVar1) || ((bool)textures_legacy[0]._3_1_)) {
    textures_legacy[0]._2_1_ = 1;
    textures_legacy[0]._1_1_ = 0;
    local_38[0] = 0;
    local_38[1] = 0;
    textures_dsa[7][0] = 0;
    textures_dsa[7][1] = 0;
    textures_dsa[8][0] = 0;
    textures_dsa[8][1] = 0;
    textures_dsa[5][0] = 0;
    textures_dsa[5][1] = 0;
    textures_dsa[6][0] = 0;
    textures_dsa[6][1] = 0;
    textures_dsa[3][0] = 0;
    textures_dsa[3][1] = 0;
    textures_dsa[4][0] = 0;
    textures_dsa[4][1] = 0;
    textures_dsa[1][0] = 0;
    textures_dsa[1][1] = 0;
    textures_dsa[2][0] = 0;
    textures_dsa[2][1] = 0;
    uStack_98 = 0;
    textures_dsa[0][0] = 0;
    textures_dsa[0][1] = 0;
    textures_dsa[9][0] = 0;
    textures_dsa[9][1] = 0;
    (**(code **)(lVar6 + 0x6f8))(2,local_38);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"glGenTextures has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x7b);
    for (local_a8 = 0; local_a8 < 2; local_a8 = local_a8 + 1) {
      cVar2 = (**(code **)(lVar6 + 0xcc8))(textures_legacy[(ulong)local_a8 - 2]);
      if (cVar2 != '\0') {
        textures_legacy[0]._2_1_ = 0;
        pTVar7 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        pTVar8 = tcu::TestContext::getLog(pTVar7);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)&i_1,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar9 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)&i_1,
                            (char (*) [76])
                            "GenTextures has created default objects, but it should create only a names."
                           );
        tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&i_1);
      }
    }
    for (local_22c = 0; local_22c < 0xb; local_22c = local_22c + 1) {
      (**(code **)(lVar6 + 0x400))
                (iterate::texture_targets[local_22c],2,textures_dsa + ((ulong)local_22c - 1));
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glCreateTextures has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                      ,0x8f);
      for (local_230 = 0; local_230 < 2; local_230 = local_230 + 1) {
        cVar2 = (**(code **)(lVar6 + 0xcc8))(textures_dsa[(ulong)local_22c - 1][local_230]);
        if (cVar2 == '\0') {
          textures_legacy[0]._2_1_ = 0;
          pTVar7 = deqp::Context::getTestContext((this->super_TestCase).m_context);
          pTVar8 = tcu::TestContext::getLog(pTVar7);
          tcu::TestLog::operator<<(&local_3b0,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar9 = tcu::MessageBuilder::operator<<
                             (&local_3b0,
                              (char (*) [59])
                              "CreateTextures has not created default objects for target ");
          EVar10 = glu::getTextureTargetStr(iterate::texture_targets[local_22c]);
          local_3c0.m_getName = EVar10.m_getName;
          local_3c0.m_value = EVar10.m_value;
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_3c0);
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0x2b5e49a);
          tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_3b0);
        }
      }
    }
    for (local_3d4 = 0; local_3d4 < 2; local_3d4 = local_3d4 + 1) {
      if (textures_legacy[(ulong)local_3d4 - 2] != 0) {
        (**(code **)(lVar6 + 0x480))(1);
        textures_legacy[(ulong)local_3d4 - 2] = 0;
      }
      for (local_3d8 = 0; local_3d8 < 0xb; local_3d8 = local_3d8 + 1) {
        if (textures_dsa[(ulong)local_3d8 - 1][local_3d4] != 0) {
          (**(code **)(lVar6 + 0x480))(1);
          textures_dsa[(ulong)local_3d8 - 1][local_3d4] = 0;
        }
      }
    }
    do {
      iVar3 = (**(code **)(lVar6 + 0x800))();
    } while (iVar3 != 0);
    if ((textures_legacy[0]._2_1_ & 1) == 0) {
      if ((textures_legacy[0]._1_1_ & 1) == 0) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_INTERNAL_ERROR,"Error");
      }
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult CreationTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Textures' objects */
	static const glw::GLenum texture_targets[] = { GL_TEXTURE_1D,
												   GL_TEXTURE_2D,
												   GL_TEXTURE_3D,
												   GL_TEXTURE_1D_ARRAY,
												   GL_TEXTURE_2D_ARRAY,
												   GL_TEXTURE_RECTANGLE,
												   GL_TEXTURE_CUBE_MAP,
												   GL_TEXTURE_CUBE_MAP_ARRAY,
												   GL_TEXTURE_BUFFER,
												   GL_TEXTURE_2D_MULTISAMPLE,
												   GL_TEXTURE_2D_MULTISAMPLE_ARRAY };
	static const glw::GLuint texture_targets_count = sizeof(texture_targets) / sizeof(texture_targets[0]);
	static const glw::GLuint textures_count		   = 2;

	glw::GLuint textures_legacy[textures_count]						= {};
	glw::GLuint textures_dsa[texture_targets_count][textures_count] = {};

	try
	{
		/* Check legacy state creation. */
		gl.genTextures(textures_count, textures_legacy);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

		for (glw::GLuint i = 0; i < textures_count; ++i)
		{
			if (gl.isTexture(textures_legacy[i]))
			{
				is_ok = false;

				/* Log. */
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "GenTextures has created default objects, but it should create only a names."
					<< tcu::TestLog::EndMessage;
			}
		}

		/* Check direct state creation. */
		for (glw::GLuint j = 0; j < texture_targets_count; ++j)
		{
			gl.createTextures(texture_targets[j], textures_count, textures_dsa[j]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateTextures has failed");

			for (glw::GLuint i = 0; i < textures_count; ++i)
			{
				if (!gl.isTexture(textures_dsa[j][i]))
				{
					is_ok = false;

					/* Log. */
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "CreateTextures has not created default objects for target "
						<< glu::getTextureTargetStr(texture_targets[j]) << "." << tcu::TestLog::EndMessage;
				}
			}
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	for (glw::GLuint i = 0; i < textures_count; ++i)
	{
		if (textures_legacy[i])
		{
			gl.deleteTextures(1, &textures_legacy[i]);

			textures_legacy[i] = 0;
		}

		for (glw::GLuint j = 0; j < texture_targets_count; ++j)
		{
			if (textures_dsa[j][i])
			{
				gl.deleteTextures(1, &textures_dsa[j][i]);

				textures_dsa[j][i] = 0;
			}
		}
	}

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}